

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O2

void __thiscall
RegisterParserTestIgnoreIndentedBlankLines::RegisterParserTestIgnoreIndentedBlankLines
          (RegisterParserTestIgnoreIndentedBlankLines *this)

{
  RegisterTest(ParserTestIgnoreIndentedBlankLines::Create,"ParserTest.IgnoreIndentedBlankLines");
  return;
}

Assistant:

TEST_F(ParserTest, IgnoreIndentedBlankLines) {
  // the indented blanks used to cause parse errors
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"  \n"
"rule cat\n"
"  command = cat $in > $out\n"
"  \n"
"build result: cat in_1.cc in-2.O\n"
"  \n"
"variable=1\n"));

  // the variable must be in the top level environment
  EXPECT_EQ("1", state.bindings_.LookupVariable("variable"));
}